

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_133c8f4::QChildProcess::startProcess(QChildProcess *this)

{
  QFlagsStorageHelper<QProcess::UnixProcessFlag,_4> QVar1;
  uint uVar2;
  _Head_base<0UL,_char_**,_false> __argv;
  _Head_base<0UL,_char_**,_false> __envp;
  char cVar3;
  int iVar4;
  QFlagsStorage<QProcess::UnixProcessFlag> QVar5;
  __pid_t _Var6;
  __gid_t __gid;
  __uid_t __uid;
  int iVar7;
  int *piVar8;
  QProcessPrivate *d;
  int sig;
  int iVar9;
  char *pcVar10;
  undefined4 uVar11;
  _Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false> this_00;
  _union_1457 local_158;
  undefined1 *puStack_150;
  sigset_t set;
  
  QProcessPrivate::commitChannels(this->d);
  qt_safe_close(this->d->childStartedPipe[0]);
  if ((-1 < this->workingDirectory) && (iVar4 = fchdir(this->workingDirectory), iVar4 == -1)) {
    d = this->d;
    piVar8 = __errno_location();
    iVar4 = *piVar8;
    pcVar10 = "fchdir";
    goto LAB_003d47c3;
  }
  this_00._M_head_impl =
       (this->d->unixExtras)._M_t.
       super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
       ._M_t.
       super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
       .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
  if (this_00._M_head_impl == (UnixExtras *)0x0) {
    QtVforkSafe::change_sigpipe((__sighandler_t)0x0);
LAB_003d4761:
    restoreSignalMask(this);
  }
  else {
    if (*(_Manager_type *)((long)&(this_00._M_head_impl)->childProcessModifier + 0x10) !=
        (_Manager_type)0x0) {
      std::function<void_()>::operator()(&(this_00._M_head_impl)->childProcessModifier);
      this_00._M_head_impl =
           (this->d->unixExtras)._M_t.
           super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
           ._M_t.
           super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
           .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl;
    }
    QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i =
         ((this_00._M_head_impl)->processParameters).flags.
         super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
         super_QFlagsStorage<QProcess::UnixProcessFlag>;
    QVar5 = QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    if (((uint)QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i & 2) != 0) {
      QtVforkSafe::change_sigpipe((__sighandler_t)0x1);
      QVar5.i = ((this_00._M_head_impl)->processParameters).flags.
                super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    }
    if ((QVar5.i & 1) != 0) {
      memset(&local_158,0,0x98);
      for (iVar4 = 1; iVar4 != 0x41; iVar4 = iVar4 + 1) {
        if (((byte)QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i >> 1 & iVar4 == 0xd) == 0)
        {
          sigaction(iVar4,(sigaction *)&local_158,(sigaction *)0x0);
        }
      }
      set.__val[0xe] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[0xf] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[0xc] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[0xd] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[10] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[0xb] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[8] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[9] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[6] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[7] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[4] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[5] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[2] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[3] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[0] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      set.__val[1] = (unsigned_long)&DAT_aaaaaaaaaaaaaaaa;
      sigemptyset((sigset_t *)&set);
      sigprocmask(2,(sigset_t *)&set,(sigset_t *)0x0);
      QVar5.i = ((this_00._M_head_impl)->processParameters).flags.
                super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    }
    if ((QVar5.i & 0x10) != 0) {
      iVar4 = ((this_00._M_head_impl)->processParameters).lowestFileDescriptorToClose;
      iVar9 = 3;
      if (3 < iVar4) {
        iVar9 = iVar4;
      }
      iVar4 = close_range(iVar9,0x7fffffff,4);
      if (iVar4 == -1) {
        local_158.sa_handler = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
        puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
        iVar4 = getrlimit(RLIMIT_NOFILE,(rlimit *)&local_158);
        uVar11 = 0x7fffffff;
        if (iVar4 == 0) {
          uVar11 = local_158._0_4_;
        }
        for (; iVar9 < (int)uVar11; iVar9 = iVar9 + 1) {
          fcntl(iVar9,2,1);
        }
      }
    }
    QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i =
         ((this_00._M_head_impl)->processParameters).flags.
         super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
         super_QFlagsStorage<QProcess::UnixProcessFlag>;
    cVar3 = (char)QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    if (((uint)QVar1.super_QFlagsStorage<QProcess::UnixProcessFlag>.i & 0x40) != 0) {
      _Var6 = setsid();
      if (_Var6 < 0) {
        pcVar10 = "setsid";
        piVar8 = __errno_location();
        goto LAB_003d4915;
      }
      cVar3 = (char)(Int)((this_00._M_head_impl)->processParameters).flags.
                         super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                         super_QFlagsStorage<QProcess::UnixProcessFlag>;
    }
    if ((cVar3 < '\0') && (iVar4 = ::open("/dev/tty",0x100), -1 < iVar4)) {
      iVar7 = ioctl(iVar4,0x5422);
      piVar8 = __errno_location();
      iVar9 = *piVar8;
      close(iVar4);
      if (iVar7 != 0) {
        *piVar8 = iVar9;
        pcVar10 = "ioctl";
LAB_003d4915:
        failChildProcess(this->d,pcVar10,*piVar8);
      }
    }
    QVar5.i = ((this_00._M_head_impl)->processParameters).flags.
              super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
              super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    if ((QVar5.i >> 9 & 1) != 0) {
      local_158.sa_handler = (__sighandler_t)&DAT_aaaaaaaaaaaaaaaa;
      puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
      iVar4 = getrlimit(RLIMIT_CORE,(rlimit *)&local_158);
      if ((iVar4 == 0) && (local_158.sa_handler != (__sighandler_t)0x0)) {
        local_158.sa_handler = (__sighandler_t)0x0;
        setrlimit(RLIMIT_CORE,(rlimit *)&local_158);
      }
      QVar5.i = ((this_00._M_head_impl)->processParameters).flags.
                super_QFlagsStorageHelper<QProcess::UnixProcessFlag,_4>.
                super_QFlagsStorage<QProcess::UnixProcessFlag>.i;
    }
    if ((QVar5.i >> 8 & 1) != 0) {
      __gid = getgid();
      setgid(__gid);
      __uid = getuid();
      setuid(__uid);
    }
    uVar2 = *(uint *)&(((this->d->unixExtras)._M_t.
                        super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
                        .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl)->
                      processParameters).flags;
    if ((uVar2 & 3) == 0) {
      QtVforkSafe::change_sigpipe((__sighandler_t)0x0);
    }
    if ((uVar2 & 1) == 0) goto LAB_003d4761;
  }
  __argv._M_head_impl =
       (this->argv).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  __envp._M_head_impl =
       (this->envp).pointers._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*[]>_>._M_t
       .super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*[]>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  pcVar10 = *__argv._M_head_impl;
  if (__envp._M_head_impl == (char **)0x0) {
    do {
      iVar4 = execv(pcVar10,__argv._M_head_impl);
      if (iVar4 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
  }
  else {
    do {
      iVar4 = execve(pcVar10,__argv._M_head_impl,__envp._M_head_impl);
      if (iVar4 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
  }
  d = this->d;
  piVar8 = __errno_location();
  iVar4 = *piVar8;
  pcVar10 = "execve";
LAB_003d47c3:
  failChildProcess(d,pcVar10,iVar4);
}

Assistant:

void QChildProcess::startProcess() const noexcept
{
    // Render channels configuration.
    d->commitChannels();

    // make sure this fd is closed if execv() succeeds
    qt_safe_close(d->childStartedPipe[0]);

    // enter the working directory
    if (workingDirectory >= 0 && fchdir(workingDirectory) == -1)
        failChildProcess(d, "fchdir", errno);

    bool sigpipeHandled = false;
    bool sigmaskHandled = false;
    if (d->unixExtras) {
        // FIRST we call the user modifier function, before we dropping
        // privileges or closing non-standard file descriptors
        callChildProcessModifier(d);

        // then we apply our other user-provided parameters
        if (const char *what = applyProcessParameters(d->unixExtras->processParameters))
            failChildProcess(d, what, errno);

        auto flags = d->unixExtras->processParameters.flags;
        using P = QProcess::UnixProcessFlag;
        sigpipeHandled = flags.testAnyFlags(P::ResetSignalHandlers | P::IgnoreSigPipe);
        sigmaskHandled = flags.testFlag(P::ResetSignalHandlers);
    }
    if (!sigpipeHandled) {
        // reset the signal that we ignored
        QtVforkSafe::change_sigpipe(SIG_DFL);       // reset the signal that we ignored
    }
    if (!sigmaskHandled) {
        // restore the signal mask from the parent, if applyProcessParameters()
        // hasn't completely reset it
        restoreSignalMask();
    }

    // execute the process
    if (!envp.pointers)
        qt_safe_execv(argv[0], argv);
    else
        qt_safe_execve(argv[0], argv, envp);
    failChildProcess(d, "execve", errno);
}